

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O3

bool __thiscall cmCTestCurl::InitCurl(cmCTestCurl *this)

{
  CURL *curl;
  string local_58;
  string local_38;
  
  curl = this->Curl;
  if (curl != (CURL *)0x0) {
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    cmCurlSetCAInfo(&local_38,curl,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    if (this->VerifyPeerOff == true) {
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_SSL_VERIFYPEER,0);
    }
    if (this->VerifyHostOff == true) {
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_SSL_VERIFYHOST,0);
    }
    if ((this->HTTPProxy)._M_string_length != 0) {
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_PROXY,(this->HTTPProxy)._M_dataplus._M_p);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_PROXYTYPE,(ulong)this->HTTPProxyType);
      if ((this->HTTPProxyAuth)._M_string_length != 0) {
        curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_PROXYUSERPWD,
                         (this->HTTPProxyAuth)._M_dataplus._M_p);
      }
    }
    if (this->UseHttp10 == true) {
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_HTTP_VERSION,1);
    }
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_FAILONERROR,1);
    if (this->TimeOutSeconds != 0) {
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_LOW_SPEED_LIMIT,1);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_LOW_SPEED_TIME,
                       (ulong)(uint)this->TimeOutSeconds);
    }
  }
  return curl != (CURL *)0x0;
}

Assistant:

bool cmCTestCurl::InitCurl()
{
  if (!this->Curl) {
    return false;
  }
  cmCurlSetCAInfo(this->Curl);
  if (this->VerifyPeerOff) {
    curl_easy_setopt(this->Curl, CURLOPT_SSL_VERIFYPEER, 0);
  }
  if (this->VerifyHostOff) {
    curl_easy_setopt(this->Curl, CURLOPT_SSL_VERIFYHOST, 0);
  }
  if (!this->HTTPProxy.empty()) {
    curl_easy_setopt(this->Curl, CURLOPT_PROXY, this->HTTPProxy.c_str());
    curl_easy_setopt(this->Curl, CURLOPT_PROXYTYPE, this->HTTPProxyType);
    if (!this->HTTPProxyAuth.empty()) {
      curl_easy_setopt(this->Curl, CURLOPT_PROXYUSERPWD,
                       this->HTTPProxyAuth.c_str());
    }
  }
  if (this->UseHttp10) {
    curl_easy_setopt(this->Curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_0);
  }
  // enable HTTP ERROR parsing
  curl_easy_setopt(this->Curl, CURLOPT_FAILONERROR, 1);

  // if there is little to no activity for too long stop submitting
  if (this->TimeOutSeconds) {
    curl_easy_setopt(this->Curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    curl_easy_setopt(this->Curl, CURLOPT_LOW_SPEED_TIME, this->TimeOutSeconds);
  }

  return true;
}